

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void __thiscall Lexer_Identifiers_Test::~Lexer_Identifiers_Test(Lexer_Identifiers_Test *this)

{
  Lexer_Identifiers_Test *this_local;
  
  ~Lexer_Identifiers_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, Identifiers) {
	MockLexer mock = mock_new("hello _3hello h_e_ll_o h3ll0 _014 _h35_o");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("hello", 5));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("_3hello", 7));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("h_e_ll_o", 8));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("h3ll0", 5));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("_014", 4));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("_h35_o", 6));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}